

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ansv.cpp
# Opt level: O3

void check_ansv<unsigned_long,1>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *nsv,bool left,size_t nonsv)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  unsigned_long *puVar2;
  pointer puVar3;
  bool bVar4;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var6;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  range_end;
  char *pcVar7;
  char *in_R9;
  size_t s;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  minquery;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  Message local_f0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  AssertHelper local_e0;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  char local_c9;
  string local_c8;
  AssertHelper local_a8;
  rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  local_a0;
  
  rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  ::rmq(&local_a0,
        (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         )(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start,
        (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
         )(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish,0x100,8);
  local_d8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var6._M_current =
       (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start;
  range_end._M_current =
       (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if ((long)range_end._M_current - (long)_Var6._M_current != 0) {
    pbVar5 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)range_end._M_current - (long)_Var6._M_current >> 3);
    local_c9 = !left;
    do {
      pbVar1 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start[(long)local_d8];
      if (pbVar1 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)nonsv
         ) {
        if (local_d8 ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0 ||
            local_c9 != '\0') {
          if ((!left) && (local_d8 + 1 < pbVar5)) {
            _Var6 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                    ::query(&local_a0,_Var6._M_current + (long)local_d8,range_end);
            local_f0.ss_.ptr_._0_1_ =
                 (internal)
                 ((in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start[(long)local_d8] == *_Var6._M_current);
            local_e8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
            ;
            if (!(bool)local_f0.ss_.ptr_._0_1_) {
              testing::Message::Message((Message *)&local_f8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_f8.ptr_ + 0x10)," at i=",6);
              std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_c8,(internal *)&local_f0,(AssertionResult *)"in[i] == m","false",
                         "true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_e0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                         ,0x2c,(char *)CONCAT71(local_c8._M_dataplus._M_p._1_7_,
                                                (char)local_c8._M_dataplus._M_p));
              testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_f8);
              testing::internal::AssertHelper::~AssertHelper(&local_e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_c8._M_dataplus._M_p._1_7_,(char)local_c8._M_dataplus._M_p) !=
                  &local_c8.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_c8._M_dataplus._M_p._1_7_,
                                         (char)local_c8._M_dataplus._M_p));
              }
              if (((local_f8.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                  && (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
                 (local_f8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_f8.ptr_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_e8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
        }
        else {
          _Var6 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                  ::query(&local_a0,_Var6,_Var6._M_current + (long)(local_d8 + 1));
          puVar2 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (puVar2[(long)local_d8] == *_Var6._M_current) {
            local_f0.ss_.ptr_._0_1_ = (internal)0x1;
            local_e8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
            ;
          }
          else {
            local_f0.ss_.ptr_._0_1_ = (internal)(*puVar2 == *_Var6._M_current);
            local_e8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
            ;
            if (!(bool)local_f0.ss_.ptr_._0_1_) {
              testing::Message::Message((Message *)&local_f8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_f8.ptr_ + 0x10)," at i=",6);
              std::ostream::_M_insert<unsigned_long>((ulong)(local_f8.ptr_ + 0x10));
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_c8,(internal *)&local_f0,
                         (AssertionResult *)"in[i] == m || in[0] == m","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_e0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                         ,0x29,(char *)CONCAT71(local_c8._M_dataplus._M_p._1_7_,
                                                (char)local_c8._M_dataplus._M_p));
              testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_f8);
              testing::internal::AssertHelper::~AssertHelper(&local_e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_c8._M_dataplus._M_p._1_7_,(char)local_c8._M_dataplus._M_p) !=
                  &local_c8.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_c8._M_dataplus._M_p._1_7_,
                                         (char)local_c8._M_dataplus._M_p));
              }
              if (((local_f8.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                  && (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
                 (local_f8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_f8.ptr_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
      }
      else {
        local_f8.ptr_ = pbVar1;
        if (left) {
          testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
                    ((internal *)&local_c8,"s","i",(unsigned_long *)&local_f8,
                     (unsigned_long *)&local_d8);
          if ((char)local_c8._M_dataplus._M_p == '\0') {
            testing::Message::Message(&local_f0);
            pcVar7 = "";
            if ((undefined8 *)local_c8._M_string_length != (undefined8 *)0x0) {
              pcVar7 = *(char **)local_c8._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_e0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0x31,pcVar7);
            testing::internal::AssertHelper::operator=(&local_e0,&local_f0);
            testing::internal::AssertHelper::~AssertHelper(&local_e0);
            if (((CONCAT71(local_f0.ss_.ptr_._1_7_,local_f0.ss_.ptr_._0_1_) != 0) &&
                (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
               ((long *)CONCAT71(local_f0.ss_.ptr_._1_7_,local_f0.ss_.ptr_._0_1_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT71(local_f0.ss_.ptr_._1_7_,local_f0.ss_.ptr_._0_1_) + 8))
                        ();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_c8._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (local_f8.ptr_ + 1 < local_d8) {
            puVar3 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            _Var6 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                    ::query(&local_a0,
                            (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )(puVar3 + (long)(local_f8.ptr_ + 1)),
                            (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )(puVar3 + (long)local_d8));
            puVar3 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            if (puVar3[(long)local_d8] < *_Var6._M_current) {
              local_f0.ss_.ptr_._0_1_ = (internal)(puVar3[(long)local_f8.ptr_] < *_Var6._M_current);
              local_e8.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_f0.ss_.ptr_._0_1_) goto LAB_0012cd77;
            }
            else {
              local_f0.ss_.ptr_._0_1_ = (internal)0x0;
LAB_0012cd77:
              local_e8.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              testing::Message::Message((Message *)&local_e0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_c8,(internal *)&local_f0,(AssertionResult *)"in[i] < m && in[s] < m"
                         ,"false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_a8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                         ,0x4c,(char *)CONCAT71(local_c8._M_dataplus._M_p._1_7_,
                                                (char)local_c8._M_dataplus._M_p));
              testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_e0);
              testing::internal::AssertHelper::~AssertHelper(&local_a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_c8._M_dataplus._M_p._1_7_,(char)local_c8._M_dataplus._M_p) !=
                  &local_c8.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_c8._M_dataplus._M_p._1_7_,
                                         (char)local_c8._M_dataplus._M_p));
              }
              if (((local_e0.data_ != (AssertHelperData *)0x0) &&
                  (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
                 (local_e0.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_e0.data_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_e8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          puVar3 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                    ((internal *)&local_c8,"in[s]","in[i]",puVar3 + (long)local_f8.ptr_,
                     puVar3 + (long)local_d8);
          if ((char)local_c8._M_dataplus._M_p == '\0') {
            testing::Message::Message(&local_f0);
            pcVar7 = "";
            if ((undefined8 *)local_c8._M_string_length != (undefined8 *)0x0) {
              pcVar7 = *(char **)local_c8._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_e0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0x53,pcVar7);
            testing::internal::AssertHelper::operator=(&local_e0,&local_f0);
            testing::internal::AssertHelper::~AssertHelper(&local_e0);
            if (((CONCAT71(local_f0.ss_.ptr_._1_7_,local_f0.ss_.ptr_._0_1_) != 0) &&
                (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
               ((long *)CONCAT71(local_f0.ss_.ptr_._1_7_,local_f0.ss_.ptr_._0_1_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT71(local_f0.ss_.ptr_._1_7_,local_f0.ss_.ptr_._0_1_) + 8))
                        ();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_c8._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
                    ((internal *)&local_c8,"s","i",(unsigned_long *)&local_f8,
                     (unsigned_long *)&local_d8);
          if ((char)local_c8._M_dataplus._M_p == '\0') {
            testing::Message::Message(&local_f0);
            pcVar7 = "";
            if ((undefined8 *)local_c8._M_string_length != (undefined8 *)0x0) {
              pcVar7 = *(char **)local_c8._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_e0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0x57,pcVar7);
            testing::internal::AssertHelper::operator=(&local_e0,&local_f0);
            testing::internal::AssertHelper::~AssertHelper(&local_e0);
            if (((CONCAT71(local_f0.ss_.ptr_._1_7_,local_f0.ss_.ptr_._0_1_) != 0) &&
                (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
               ((long *)CONCAT71(local_f0.ss_.ptr_._1_7_,local_f0.ss_.ptr_._0_1_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT71(local_f0.ss_.ptr_._1_7_,local_f0.ss_.ptr_._0_1_) + 8))
                        ();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_c8._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (local_d8 < local_f8.ptr_ + -1) {
            puVar3 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            _Var6 = rmq<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                    ::query(&local_a0,
                            (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )(puVar3 + (long)(local_d8 + 1)),
                            (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             )(puVar3 + (long)local_f8.ptr_));
            puVar3 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start;
            if (puVar3[(long)local_d8] < *_Var6._M_current) {
              local_f0.ss_.ptr_._0_1_ = (internal)(puVar3[(long)local_f8.ptr_] < *_Var6._M_current);
              local_e8.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_f0.ss_.ptr_._0_1_) goto LAB_0012cee2;
            }
            else {
              local_f0.ss_.ptr_._0_1_ = (internal)0x0;
LAB_0012cee2:
              local_e8.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              testing::Message::Message((Message *)&local_e0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&(local_e0.data_)->line," for range [",0xc);
              std::ostream::_M_insert<unsigned_long>((ulong)&(local_e0.data_)->line);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&(local_e0.data_)->line,",",1);
              std::ostream::_M_insert<unsigned_long>((ulong)&(local_e0.data_)->line);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&(local_e0.data_)->line,"]",1);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_c8,(internal *)&local_f0,(AssertionResult *)"in[i] < m && in[s] < m"
                         ,"false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_a8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                         ,0x70,(char *)CONCAT71(local_c8._M_dataplus._M_p._1_7_,
                                                (char)local_c8._M_dataplus._M_p));
              testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_e0);
              testing::internal::AssertHelper::~AssertHelper(&local_a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_c8._M_dataplus._M_p._1_7_,(char)local_c8._M_dataplus._M_p) !=
                  &local_c8.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_c8._M_dataplus._M_p._1_7_,
                                         (char)local_c8._M_dataplus._M_p));
              }
              if (((local_e0.data_ != (AssertHelperData *)0x0) &&
                  (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
                 (local_e0.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_e0.data_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_e8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          puVar3 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                    ((internal *)&local_c8,"in[s]","in[i]",puVar3 + (long)local_f8.ptr_,
                     puVar3 + (long)local_d8);
          if ((char)local_c8._M_dataplus._M_p == '\0') {
            testing::Message::Message(&local_f0);
            pcVar7 = "";
            if ((undefined8 *)local_c8._M_string_length != (undefined8 *)0x0) {
              pcVar7 = *(char **)local_c8._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_e0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0x77,pcVar7);
            testing::internal::AssertHelper::operator=(&local_e0,&local_f0);
            testing::internal::AssertHelper::~AssertHelper(&local_e0);
            if (((CONCAT71(local_f0.ss_.ptr_._1_7_,local_f0.ss_.ptr_._0_1_) != 0) &&
                (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
               ((long *)CONCAT71(local_f0.ss_.ptr_._1_7_,local_f0.ss_.ptr_._0_1_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT71(local_f0.ss_.ptr_._1_7_,local_f0.ss_.ptr_._0_1_) + 8))
                        ();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_c8._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
      }
      local_d8 = local_d8 + 1;
      _Var6._M_current =
           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
      range_end._M_current =
           (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      pbVar5 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)range_end._M_current - (long)_Var6._M_current >> 3);
    } while (local_d8 < pbVar5);
  }
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_a0.block_mins);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_a0.superblock_mins);
  return;
}

Assistant:

void check_ansv(const std::vector<T>& in, const std::vector<size_t>& nsv, bool left, size_t nonsv) {
    // construct RMQ
    rmq<typename std::vector<T>::const_iterator> minquery(in.cbegin(), in.cend());

    // for each position check the nsv and direction
    for (size_t i = 0; i < in.size(); ++i) {
        if (nsv[i] == nonsv) {
            if (left && i > 0) {
                // expect this is an overall minimum of the range [0, i]
                T m = *minquery.query(in.cbegin(), in.cbegin()+i+1);
                EXPECT_TRUE(in[i] == m || in[0] == m) << " at i=" << i;
            } else if (!left && i+1 < in.size()) {
                T m = *minquery.query(in.cbegin()+i, in.cend());
                EXPECT_TRUE(in[i] == m) << " at i=" << i;
            }
        } else {
            size_t s = nsv[i];
            if (left) {
                EXPECT_LT(s, i);
                // no other element can be smaller than `in[i]` after `in[s]`
                if (s+1 < i) {
                    T m = *minquery.query(in.cbegin()+s+1, in.cbegin()+i);
                    if (type == nearest_sm) {
                        // check that there is nothing smaller than in[i] in the range
                        EXPECT_TRUE(in[i] <= m && in[s] < m) << " for range [" << s+1 << "," << i << "]";
                    } else if (type == furthest_eq) {
                        // test that no smaller values lay in between
                        EXPECT_TRUE(in[i] <= m && in[s] <= m);

                        // test if the nsv is actually the furthest
                        if (in[i] == in[s]) {
                            // if equal, then s has to be the furthest
                            // we check that the nsv for s is smaller, not equal
                            if (nsv[s] != nonsv) {
                                EXPECT_LT(in[nsv[s]], in[i]) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();
                                if (nsv[s]+1 < s) {
                                    T m2 = *minquery.query(in.cbegin()+nsv[s]+1, in.cbegin()+s);
                                    EXPECT_GT(m2, in[i]);
                                }
                            }
                        } else {
                            // if not equal, there can't be any equal ones in between
                            EXPECT_LT(in[i], m) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s;
                        }
                    } else { // type == nearest_eq
                        EXPECT_TRUE(in[i] < m && in[s] < m);
                    }
                }
                // element at `s` is smaller than `in[i]`
                if (type == nearest_sm) {
                    EXPECT_LT(in[s], in[i]);
                } else {
                    EXPECT_LE(in[s], in[i]);
                }

            } else {
                EXPECT_GT(s, i);
                // no other element can be smaller than `in[i]` before `in[s]`
                if (i < s-1) {
                    T m = *minquery.query(in.cbegin()+i+1, in.cbegin()+s);
                    if (type == nearest_sm) {
                        EXPECT_TRUE(in[i] <= m && in[s] < m) << " for range [" << i << "," << s-1 << "]";
                    } else if (type == furthest_eq) {
                        EXPECT_TRUE(in[i] <= m && in[s] <= m) << " for range [" << i << "," << s-1 << "]";
                        // test if the nsv is actually the furthest
                        if (in[i] == in[s]) {
                            // if equal, then s has to be the furthest
                            // we check that the nsv for s is smaller, not equal
                            if (nsv[s] != nonsv) {
                                EXPECT_LT(in[nsv[s]], in[i]) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();
                                if (s+1 < nsv[s]) {
                                    T m2 = *minquery.query(in.cbegin()+s+1, in.cbegin()+nsv[s]);
                                    EXPECT_GT(m2, in[i]) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();

                                }
                            }
                        } else {
                            // if not equal, there can't be any equal ones in between
                            EXPECT_LT(in[i], m) << " for i=" << i << ", in[i]=" << in[i] << ", in[s]=" << in[s] << ",s=" << s << ", nsv[s]=" << nsv[s] << ", in.size()=" << in.size();
                        }
                    } else { // type == nearest_eq
                        EXPECT_TRUE(in[i] < m && in[s] < m) << " for range [" << i << "," << s-1 << "]";
                    }
                }
                // element at `s` is smaller than in[i]
                if (type == nearest_sm) {
                    EXPECT_LT(in[s], in[i]);
                } else {
                    EXPECT_LE(in[s], in[i]);
                }
            }

        }
    }
}